

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ID.cpp
# Opt level: O1

void __thiscall ID_table_t::erase(ID_table_t *this,string *id_name)

{
  pointer pIVar1;
  pointer pcVar2;
  size_t __n;
  int iVar3;
  Exception *this_00;
  pointer pIVar4;
  long lVar5;
  bool bVar6;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pIVar4 = (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pIVar1 = (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (pIVar4 != pIVar1) {
    lVar5 = -(long)pIVar4;
    do {
      pcVar2 = (pIVar4->name)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (pIVar4->name)._M_string_length);
      __n = id_name->_M_string_length;
      if (__n == local_48) {
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp((id_name->_M_dataplus)._M_p,local_50,__n);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (bVar6) {
        std::vector<ID,_std::allocator<ID>_>::_M_erase(&this->table,(ID *)-lVar5);
        return;
      }
      pIVar4 = pIVar4 + 1;
      lVar5 = lVar5 + -0x30;
    } while (pIVar4 != pIVar1);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  Exception::Exception(this_00,"Scanner error: identifier not found: ",id_name);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void ID_table_t::erase(const string& id_name){
    vector<ID>::iterator ptr = table.begin();
    vector<ID>::iterator end  = table.end();

    while(ptr != end){
        if(id_name == ptr->get_name()){
            table.erase(ptr);
            return;
        }
        ++ptr;
    }
    throw Exception("Scanner error: identifier not found: ", id_name);
}